

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O0

int read_header(FILE *fp,char ***field_names)

{
  char cVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  int local_4e58;
  int chr_pos;
  int iStack_4e4c;
  char chr;
  int h_field_len;
  int h_field_index;
  char h_field [10000];
  char header [10000];
  char **tmp_field_names;
  char ***field_names_local;
  FILE *fp_local;
  
  iStack_4e4c = 0;
  chr_pos = 0;
  if (fp == (FILE *)0x0) {
    *field_names = (char **)0x0;
    fp_local._4_4_ = -1;
  }
  else {
    ppcVar3 = (char **)malloc(8);
    *field_names = ppcVar3;
    if (*field_names == (char **)0x0) {
      fp_local._4_4_ = -1;
    }
    else {
      memset(&h_field_len,0,10000);
      pcVar4 = fgets(h_field + 0x2708,10000,(FILE *)fp);
      if (pcVar4 == (char *)0x0) {
        free(*field_names);
        *field_names = (char **)0x0;
        fp_local._4_4_ = -1;
      }
      else {
        local_4e58 = 0;
        while( true ) {
          iVar2 = local_4e58 + 1;
          cVar1 = h_field[(long)local_4e58 + 0x2708];
          if (cVar1 == '\0') break;
          local_4e58 = iVar2;
          if ((cVar1 == ',') || (cVar1 == '\n')) {
            ppcVar3 = (char **)realloc(*field_names,(long)(iStack_4e4c + 1) << 3);
            if (ppcVar3 == (char **)0x0) {
              free_cstr_arr(*field_names,(long)iStack_4e4c);
              *field_names = (char **)0x0;
              return -1;
            }
            *field_names = ppcVar3;
            pcVar4 = strdup((char *)&h_field_len);
            (*field_names)[iStack_4e4c] = pcVar4;
            if ((*field_names)[iStack_4e4c] == (char *)0x0) {
              free_cstr_arr(*field_names,(long)iStack_4e4c);
              *field_names = (char **)0x0;
              return -1;
            }
            memset(&h_field_len,0,10000);
            chr_pos = 0;
            iStack_4e4c = iStack_4e4c + 1;
          }
          else if ((cVar1 != '\n') && (cVar1 != '\r')) {
            *(char *)((long)&h_field_len + (long)chr_pos) = cVar1;
            chr_pos = chr_pos + 1;
          }
        }
        fp_local._4_4_ = iStack_4e4c;
      }
    }
  }
  return fp_local._4_4_;
}

Assistant:

int read_header(FILE *fp, char ***field_names) {
    char **tmp_field_names;
    char header[LINE_MAX_LEN];
    char h_field[LINE_MAX_LEN];
    int h_field_index = 0;
    int h_field_len = 0;

    if (fp == NULL) {
        *field_names = NULL;
        return -1;
    }

    *field_names = malloc(sizeof(char *));
    if (*field_names == NULL) {
        return -1;
    }
    memset(h_field, 0, LINE_MAX_LEN);

    if (fgets(header, LINE_MAX_LEN, fp) == NULL) {
        free(*field_names);
        *field_names = NULL;
        return -1;
    }

    char chr;
    int chr_pos = 0;

    while ((chr = header[++chr_pos - 1])) {
        if (chr == ',' || chr == '\n') {
            tmp_field_names = realloc(*field_names, (h_field_index + 1) * sizeof(char *));
            if (tmp_field_names == NULL) {
                free_cstr_arr(*field_names, h_field_index);
                *field_names = NULL;
                return -1;
            }
            *field_names = tmp_field_names;
            (*field_names)[h_field_index] = strdup(h_field);

            if ((*field_names)[h_field_index] == NULL) {
                free_cstr_arr(*field_names, h_field_index);
                *field_names = NULL;
                return -1;
            }

            memset(h_field, 0, LINE_MAX_LEN);
            h_field_len = 0;
            h_field_index++;
        } else if (chr != '\n' && chr != '\r') {
            h_field[++h_field_len - 1] = chr;
        }
    }

    return h_field_index;
}